

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

Reference __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter>::DoReadReference
          (NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *this)

{
  int *piVar1;
  int iVar2;
  
  iVar2 = ReadUInt(this,this->num_vars_and_exprs_);
  TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
  if (iVar2 < (this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars) {
    piVar1 = &this->handler_->num_vars;
    *piVar1 = *piVar1 + 1;
  }
  return 0;
}

Assistant:

Reference DoReadReference() {
    int index = ReadUInt(num_vars_and_exprs_);
    reader_.ReadTillEndOfLine();
    return index < header_.num_vars ?
          handler_.OnVariableRef(index) :
          handler_.OnCommonExprRef(index - header_.num_vars);
  }